

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
* __thiscall
rangeless::fn::impl::take_while<rangeless::fn::impl::call_count_lt>::operator()
          (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
           *__return_storage_ptr__,take_while<rangeless::fn::impl::call_count_lt> *this,
          vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
          *cont)

{
  pointer pvVar1;
  __normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
  __first;
  
  __first = std::
            __find_if<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,std::allocator<example::aln_t>>*,std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>,__gnu_cxx::__ops::_Iter_negate<rangeless::fn::impl::call_count_lt>>
                      ((cont->
                       super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (cont->
                       super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,(this->pred).cap,
                       (this->pred).num_calls);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::_M_erase(cont,(iterator)__first._M_current,
             (cont->
             super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  pvVar1 = (cont->
           super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (cont->
       super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pvVar1;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (cont->
       super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (cont->
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (cont->
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (cont->
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Container operator()(Container cont) const
        {
            auto it = std::find_if_not(cont.begin(), cont.end(), pred);
            cont.erase(it, cont.end()); 
            return cont;
        }